

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall level_mesh::validate_instances_order(level_mesh *this)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference ppbVar4;
  __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
  local_28;
  b_model_instance_vec_it end;
  b_model_instance_vec_it it;
  uint32_t tag;
  level_mesh *this_local;
  
  uVar1 = this->m_free_tag;
  sVar3 = std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::size
                    (&this->m_instances);
  if (uVar1 != sVar3) {
    __assert_fail("m_free_tag == m_instances.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                  ,0x8e,"void level_mesh::validate_instances_order()");
  }
  it._M_current._4_4_ = 0;
  end._M_current =
       (b_model_instance **)
       std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::begin
                 (&this->m_instances);
  local_28._M_current =
       (b_model_instance **)
       std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::end(&this->m_instances)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&end,&local_28);
    if (!bVar2) {
      return;
    }
    ppbVar4 = __gnu_cxx::
              __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
              ::operator*(&end);
    if ((*ppbVar4)->tag != it._M_current._4_4_) break;
    __gnu_cxx::
    __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
    ::operator++(&end);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  __assert_fail("(*it)->tag == tag",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                ,0x91,"void level_mesh::validate_instances_order()");
}

Assistant:

void level_mesh::validate_instances_order()
{
	xr_assert(m_free_tag == m_instances.size());
	uint32_t tag = 0;
	for (b_model_instance_vec_it it = m_instances.begin(), end = m_instances.end(); it != end; ++it, ++tag)
		xr_assert((*it)->tag == tag);
}